

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O3

VOID LeaveCriticalSection(LPCRITICAL_SECTION lpCriticalSection)

{
  CPalThread *pThread;
  
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    CorUnix::InternalLeaveCriticalSection(pThread,lpCriticalSection);
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

VOID LeaveCriticalSection(LPCRITICAL_SECTION lpCriticalSection)
{
    PERF_ENTRY(LeaveCriticalSection);
    ENTRY("LeaveCriticalSection(lpCriticalSection=%p)\n", lpCriticalSection);

    CPalThread * pThread = InternalGetCurrentThread();

    InternalLeaveCriticalSection(pThread, lpCriticalSection);

    LOGEXIT("LeaveCriticalSection returns void\n");
    PERF_EXIT(LeaveCriticalSection);
}